

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O3

void __thiscall QNetworkReplyImplPrivate::_q_copyReadyRead(QNetworkReplyImplPrivate *this)

{
  QNetworkReply *this_00;
  long lVar1;
  QIODevice *pQVar2;
  char cVar3;
  longlong lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  _Storage<long_long,_true> _t2;
  long in_FS_OFFSET;
  QByteArrayView value;
  QByteArrayView QVar8;
  optional<long_long> oVar9;
  pair<QByteArray,_QByteArray> *local_38;
  
  local_38 = *(pair<QByteArray,_QByteArray> **)(in_FS_OFFSET + 0x28);
  if ((this->state == Working) && (this->copyDevice != (QIODevice *)0x0)) {
    this_00 = *(QNetworkReply **)&(this->super_QNetworkReplyPrivate).field_0x8;
    cVar3 = QIODevice::isOpen();
    if (cVar3 != '\0') {
      lVar6 = this->bytesDownloaded;
      lVar5 = lVar6;
      while( true ) {
        lVar1 = (this->super_QNetworkReplyPrivate).readBufferMaxSize;
        if (lVar1 != 0) {
          lVar7 = *(long *)&(this->super_QNetworkReplyPrivate).field_0x90;
          if (lVar7 == 0) {
            lVar7 = 0;
          }
          else {
            lVar7 = *(long *)(lVar7 + 0x18);
          }
          if (lVar1 <= lVar7) goto LAB_00198a9a;
        }
        (**(code **)(*(long *)this->copyDevice + 0xa0))();
        pQVar2 = this->copyDevice;
        lVar4 = QRingBuffer::reserve(*(longlong *)&(this->super_QNetworkReplyPrivate).field_0x90);
        lVar5 = QIODevice::read((char *)pQVar2,lVar4);
        if (lVar5 == -1) {
          QRingBuffer::chop(*(longlong *)&(this->super_QNetworkReplyPrivate).field_0x90);
          lVar5 = this->bytesDownloaded;
          goto LAB_00198a9a;
        }
        QRingBuffer::chop(*(longlong *)&(this->super_QNetworkReplyPrivate).field_0x90);
        cVar3 = (**(code **)(*(long *)this->copyDevice + 0x60))();
        if ((cVar3 == '\0') &&
           (cVar3 = (**(code **)(*(long *)this->copyDevice + 0x90))(), cVar3 != '\0')) break;
        lVar5 = this->bytesDownloaded + lVar5;
        this->bytesDownloaded = lVar5;
      }
      lVar5 = this->bytesDownloaded + lVar5;
      this->bytesDownloaded = lVar5;
LAB_00198a9a:
      if (lVar5 != lVar6) {
        QNetworkHeadersPrivate::headers((QNetworkHeadersPrivate *)&stack0xffffffffffffffc0);
        QVar8 = QHttpHeaders::value((QHttpHeaders *)&stack0xffffffffffffffc0,ContentLength,
                                    (QByteArrayView)ZEXT816(0));
        value.m_data = QVar8.m_data;
        value.m_size = (qsizetype)value.m_data;
        oVar9 = QNetworkHeadersPrivate::toInt((QNetworkHeadersPrivate *)QVar8.m_size,value);
        QHttpHeaders::~QHttpHeaders((QHttpHeaders *)&stack0xffffffffffffffc0);
        this->notificationHandlingPaused = true;
        QIODevice::readyRead();
        cVar3 = QElapsedTimer::isValid();
        if ((cVar3 != '\0') && (lVar6 = QElapsedTimer::elapsed(), 99 < lVar6)) {
          QElapsedTimer::start();
          _t2._M_value = -1;
          if (((undefined1  [16])
               oVar9.super__Optional_base<long_long,_true,_true>._M_payload.
               super__Optional_payload_base<long_long> & (undefined1  [16])0x1) !=
              (undefined1  [16])0x0) {
            _t2._M_value = oVar9.super__Optional_base<long_long,_true,_true>._M_payload.
                           super__Optional_payload_base<long_long>._M_payload;
          }
          QNetworkReply::downloadProgress(this_00,this->bytesDownloaded,_t2._M_value);
        }
        resumeNotificationHandling(this);
      }
    }
  }
  if (*(pair<QByteArray,_QByteArray> **)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QNetworkReplyImplPrivate::_q_copyReadyRead()
{
    Q_Q(QNetworkReplyImpl);
    if (state != Working)
        return;
    if (!copyDevice || !q->isOpen())
        return;

    // FIXME Optimize to use download buffer if it is a QBuffer.
    // Needs to be done where sendCacheContents() (?) of HTTP is emitting
    // metaDataChanged ?
    qint64 lastBytesDownloaded = bytesDownloaded;
    forever {
        qint64 bytesToRead = nextDownstreamBlockSize();
        if (bytesToRead == 0)
            // we'll be called again, eventually
            break;

        bytesToRead = qBound<qint64>(1, bytesToRead, copyDevice->bytesAvailable());
        qint64 bytesActuallyRead = copyDevice->read(buffer.reserve(bytesToRead), bytesToRead);
        if (bytesActuallyRead == -1) {
            buffer.chop(bytesToRead);
            break;
        }
        buffer.chop(bytesToRead - bytesActuallyRead);

        if (!copyDevice->isSequential() && copyDevice->atEnd()) {
            bytesDownloaded += bytesActuallyRead;
            break;
        }

        bytesDownloaded += bytesActuallyRead;
    }